

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::DenseVector::_internal_add_values(DenseVector *this,double value)

{
  double local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<double>::Add(&this->values_,&local_8);
  return;
}

Assistant:

inline void DenseVector::_internal_add_values(double value) {
  values_.Add(value);
}